

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RadioEntityType.cpp
# Opt level: O0

void __thiscall
KDIS::DATA_TYPE::RadioEntityType::RadioEntityType
          (RadioEntityType *this,EntityKind Kind,KUINT8 Domain,Country Country,KUINT8 Categoy,
          KUINT8 NomenclatureVersion,KUINT16 Nomenclature)

{
  KUINT8 NomenclatureVersion_local;
  KUINT8 Categoy_local;
  Country Country_local;
  KUINT8 Domain_local;
  EntityKind Kind_local;
  RadioEntityType *this_local;
  
  DataTypeBase::DataTypeBase(&this->super_DataTypeBase);
  (this->super_DataTypeBase)._vptr_DataTypeBase = (_func_int **)&PTR__RadioEntityType_0032dbb8;
  this->m_ui8EntityKind = (KUINT8)Kind;
  this->m_ui8Domain = Domain;
  this->m_ui16Country = (KUINT16)Country;
  this->m_ui8Category = Categoy;
  this->m_ui8NomenclatureVersion = NomenclatureVersion;
  this->m_ui16Nomenclature = Nomenclature;
  return;
}

Assistant:

RadioEntityType::RadioEntityType( EntityKind Kind, KUINT8 Domain, Country Country, KUINT8  Categoy,
                                  KUINT8  NomenclatureVersion, KUINT16 Nomenclature ) :
    m_ui8EntityKind( Kind ),
    m_ui8Domain( Domain ),
    m_ui16Country( Country ),
    m_ui8Category( Categoy ),
    m_ui8NomenclatureVersion( NomenclatureVersion ),
    m_ui16Nomenclature( Nomenclature )
{
}